

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.cpp
# Opt level: O2

void __thiscall GPIO::GPIOBase::SoftThread::run_pwm(SoftThread *this)

{
  uint uVar1;
  uint uVar2;
  duration<long,_std::ratio<1L,_1000000L>_> local_30;
  
  while( true ) {
    uVar1 = (this->m_mark).super___atomic_base<unsigned_int>._M_i;
    uVar2 = (this->m_space).super___atomic_base<unsigned_int>._M_i;
    if (uVar2 == 0 && uVar1 == 0) break;
    if ((ulong)uVar1 != 0) {
      gpio_addr[(ulong)(this->m_gpio >> 5) + 7] = (long)(1 << ((byte)this->m_gpio & 0x1f));
      local_30.__r = (ulong)uVar1 * 100;
      std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_30);
    }
    if ((ulong)uVar2 != 0) {
      gpio_addr[(ulong)(this->m_gpio >> 5) + 10] = (long)(1 << ((byte)this->m_gpio & 0x1f));
      local_30.__r = (ulong)uVar2 * 100;
      std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_30);
    }
  }
  return;
}

Assistant:

void GPIOBase::SoftThread::run_pwm()
{
    static const std::chrono::microseconds base_period = std::chrono::microseconds(100);
    
    for (;;) {
        unsigned int local_mark = m_mark;
        unsigned int local_space = m_space;

        // terminate?

        if (local_mark == 0 && local_space == 0) return;
        if (local_mark != 0) {
            int_set(m_gpio);
            std::this_thread::sleep_for(base_period * local_mark);
        }
        if (local_space != 0) {
            int_clear(m_gpio);
            std::this_thread::sleep_for(base_period * local_space);
        }
    }
}